

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_bases.cc
# Opt level: O3

void google::protobuf::internal::ZeroFieldsBase::MergeImpl
               (MessageLite *to_param,MessageLite *from_param)

{
  ulong uVar1;
  
  if (from_param == to_param) {
    MergeImpl();
  }
  uVar1 = (from_param->_internal_metadata_).ptr_;
  if ((uVar1 & 1) == 0) {
    return;
  }
  InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_param->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void ZeroFieldsBase::MergeImpl(MessageLite& to_param,
                               const MessageLite& from_param) {
  auto* to = static_cast<ZeroFieldsBase*>(&to_param);
  const auto* from = static_cast<const ZeroFieldsBase*>(&from_param);
  ABSL_DCHECK_NE(from, to);
  to->_internal_metadata_.MergeFrom<UnknownFieldSet>(from->_internal_metadata_);
}